

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O2

void llb_buildengine_task_needs_input(llb_task_interface_t ti,llb_data_t *key,uintptr_t input_id)

{
  TaskInterface *coreti;
  TaskInterface local_48;
  KeyType local_38;
  
  local_48.ctx = ti.ctx;
  local_48.impl = ti.impl;
  llbuild::core::KeyType::KeyType(&local_38,(char *)key->data,key->length);
  llbuild::core::TaskInterface::request(&local_48,&local_38,input_id);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_buildengine_task_needs_input(llb_task_interface_t ti,
                                      const llb_data_t* key,
                                      uintptr_t input_id) {
  auto coreti = reinterpret_cast<TaskInterface*>(&ti);
  coreti->request(KeyType((const char*)key->data, key->length), input_id);
}